

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

aiMesh * __thiscall Assimp::XGLImporter::ToOutputMesh(XGLImporter *this,TempMaterialMesh *m)

{
  uint uVar1;
  pointer paVar2;
  pointer paVar3;
  pointer puVar4;
  pointer puVar5;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> uVar6;
  _Head_base<0UL,_aiMesh_*,_false> this_00;
  ulong uVar7;
  aiVector3D *paVar8;
  long lVar9;
  ulong *puVar10;
  aiFace *paVar11;
  uint *puVar12;
  uint i;
  aiFace *paVar13;
  pointer __p;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  uint i_1;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  
  this_00._M_head_impl = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00._M_head_impl);
  paVar2 = (m->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (m->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar15 = (long)paVar3 - (long)paVar2;
  uVar7 = (long)sVar15 / 0xc;
  uVar14 = (uint)uVar7;
  *(uint *)((long)this_00._M_head_impl + 4) = uVar14;
  uVar16 = (uVar7 & 0xffffffff) * 0xc;
  mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)this_00._M_head_impl;
  paVar8 = (aiVector3D *)operator_new__(uVar16);
  if (uVar14 != 0) {
    memset(paVar8,0,((uVar16 - 0xc) - (uVar16 - 0xc) % 0xc) + 0xc);
  }
  *(aiVector3D **)((long)this_00._M_head_impl + 0x10) = paVar8;
  if (paVar3 != paVar2) {
    memmove(paVar8,paVar2,sVar15);
  }
  paVar2 = (m->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar15 = (long)(m->normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)paVar2;
  if (sVar15 != 0) {
    paVar8 = (aiVector3D *)operator_new__(uVar16);
    if (uVar14 != 0) {
      memset(paVar8,0,((uVar16 - 0xc) - (uVar16 - 0xc) % 0xc) + 0xc);
    }
    *(aiVector3D **)((long)this_00._M_head_impl + 0x18) = paVar8;
    memmove(paVar8,paVar2,sVar15);
  }
  if ((m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    *(uint *)((long)this_00._M_head_impl + 0xb0) = 2;
    uVar16 = (uVar7 & 0xffffffff) * 0xc;
    paVar8 = (aiVector3D *)operator_new__(uVar16);
    if (uVar14 != 0) {
      uVar16 = uVar16 - 0xc;
      memset(paVar8,0,(uVar16 - uVar16 % 0xc) + 0xc);
    }
    *(aiVector3D **)((long)this_00._M_head_impl + 0x70) = paVar8;
    lVar9 = 8;
    for (uVar16 = 0; uVar16 < (uVar7 & 0xffffffff); uVar16 = uVar16 + 1) {
      paVar8 = *(aiVector3D **)((long)this_00._M_head_impl + 0x70);
      *(aiVector2t<float> *)((long)paVar8 + lVar9 + -8) =
           (m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16];
      *(undefined4 *)((long)&paVar8->x + lVar9) = 0;
      uVar7 = (ulong)*(uint *)((long)mesh._M_t.
                                     super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4);
      lVar9 = lVar9 + 0xc;
      this_00._M_head_impl =
           (aiMesh *)
           mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
           super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
    }
  }
  (this_00._M_head_impl)->mNumFaces =
       (uint)((ulong)((long)(m->vcounts).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(m->vcounts).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  puVar4 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)puVar5 - (long)puVar4;
  uVar7 = lVar9 >> 2;
  puVar10 = (ulong *)operator_new__(-(ulong)(uVar7 >> 0x3c != 0) | lVar9 * 4 + 8U);
  *puVar10 = uVar7;
  paVar11 = (aiFace *)(puVar10 + 1);
  if (puVar5 != puVar4) {
    paVar13 = paVar11;
    do {
      paVar13->mNumIndices = 0;
      paVar13->mIndices = (uint *)0x0;
      paVar13 = paVar13 + 1;
    } while (paVar13 != paVar11 + uVar7);
  }
  (this_00._M_head_impl)->mFaces = paVar11;
  uVar14 = 0;
  for (uVar7 = 0;
      uVar6._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
           mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
           super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl,
      uVar7 < *(uint *)((long)this_00._M_head_impl + 8); uVar7 = uVar7 + 1) {
    paVar11 = *(aiFace **)((long)this_00._M_head_impl + 0xd0);
    uVar1 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7];
    paVar11[uVar7].mNumIndices = uVar1;
    puVar12 = (uint *)operator_new__((ulong)uVar1 << 2);
    paVar11 = paVar11 + uVar7;
    paVar11->mIndices = puVar12;
    for (uVar16 = 0; uVar16 < paVar11->mNumIndices; uVar16 = uVar16 + 1) {
      paVar11->mIndices[uVar16] = uVar14 + (int)uVar16;
    }
    uVar14 = uVar14 + (int)uVar16;
    this_00._M_head_impl = (aiMesh *)mesh;
  }
  if (uVar14 == *(uint *)((long)this_00._M_head_impl + 4)) {
    (this_00._M_head_impl)->mPrimitiveTypes = m->pflags;
    *(uint *)((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                    super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) = m->matid;
    mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
    super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
         (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
         (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)0x0;
    std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&mesh);
    return (aiMesh *)
           (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)
           uVar6._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
           super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  }
  __assert_fail("idx == mesh->mNumVertices",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/XGL/XGLLoader.cpp"
                ,0x235,"aiMesh *Assimp::XGLImporter::ToOutputMesh(const TempMaterialMesh &)");
}

Assistant:

aiMesh* XGLImporter::ToOutputMesh(const TempMaterialMesh& m)
{
    std::unique_ptr<aiMesh> mesh(new aiMesh());

    mesh->mNumVertices = static_cast<unsigned int>(m.positions.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy(m.positions.begin(),m.positions.end(),mesh->mVertices);

    if(m.normals.size()) {
        mesh->mNormals = new aiVector3D[mesh->mNumVertices];
        std::copy(m.normals.begin(),m.normals.end(),mesh->mNormals);
    }

    if(m.uvs.size()) {
        mesh->mNumUVComponents[0] = 2;
        mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];

        for(unsigned int i = 0; i < mesh->mNumVertices; ++i) {
            mesh->mTextureCoords[0][i] = aiVector3D(m.uvs[i].x,m.uvs[i].y,0.f);
        }
    }

    mesh->mNumFaces =  static_cast<unsigned int>(m.vcounts.size());
    mesh->mFaces = new aiFace[m.vcounts.size()];

    unsigned int idx = 0;
    for(unsigned int i = 0; i < mesh->mNumFaces; ++i) {
        aiFace& f = mesh->mFaces[i];
        f.mNumIndices = m.vcounts[i];
        f.mIndices = new unsigned int[f.mNumIndices];
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            f.mIndices[c] = idx++;
        }
    }

    ai_assert(idx == mesh->mNumVertices);

    mesh->mPrimitiveTypes = m.pflags;
    mesh->mMaterialIndex = m.matid;
    return mesh.release();
}